

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::relative_pose::modules::ge_main2
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *startingPoint,geOutput_t *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ActualDstType actualDst;
  long lVar9;
  double *pdVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  double currentValue;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  double dVar23;
  Matrix<std::complex<double>,_4,_4,_0,_4,_4> V_complex;
  Vector4d D;
  Matrix4d V;
  Matrix<std::complex<double>,_4,_1,_0,_4,_1> D_complex;
  Matrix4d G;
  EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> Eig;
  cayley_t local_830;
  double local_818;
  double local_810;
  double dStack_808;
  double local_7f8;
  int local_7ec;
  uint local_7e8;
  uint local_7e4;
  double local_7e0;
  double dStack_7d8;
  double local_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [16];
  double local_7b0;
  double local_6a0 [4];
  double local_680;
  double dStack_678;
  double dStack_670;
  double dStack_668;
  double dStack_660;
  double dStack_658;
  double dStack_650;
  double dStack_648;
  double local_640;
  double dStack_638;
  double dStack_630;
  double dStack_628;
  double dStack_620;
  double dStack_618;
  double dStack_610;
  double dStack_608;
  double local_600 [8];
  Matrix4d local_5c0;
  double local_508;
  double dStack_500;
  double dStack_4f8;
  double dStack_4f0;
  double dStack_4e8;
  double dStack_4e0;
  double dStack_4d8;
  double dStack_4d0;
  double local_4c8;
  undefined1 local_4c0 [128];
  double local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined2 local_400;
  bool local_1c0;
  undefined2 local_17c;
  Index local_178;
  
  auVar11 = ZEXT816(0x3fd3333333333333);
  uVar7 = 0;
  iVar6 = 0;
  do {
    local_7e4 = (uint)uVar7;
    local_7d0 = (double)((ulong)(2 < iVar6) * 0x3fe3333333333333 +
                        (ulong)(2 >= iVar6) * auVar11._0_8_);
    local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (startingPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[0];
    local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (startingPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1];
    uStack_7c8 = 0;
    local_7ec = iVar6;
    if (iVar6 == 0) {
      local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (startingPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[2];
    }
    else {
      local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (startingPoint->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[2];
      iVar6 = rand();
      local_810 = (double)CONCAT44(local_810._4_4_,iVar6);
      iVar6 = rand();
      auVar11 = vpinsrd_avx(ZEXT416(local_810._0_4_),iVar6,1);
      auVar11 = vcvtdq2pd_avx(auVar11);
      auVar1._8_8_ = 0x41dfffffffc00000;
      auVar1._0_8_ = 0x41dfffffffc00000;
      auVar11 = vdivpd_avx512vl(auVar11,auVar1);
      auVar2._8_8_ = 0xbfe0000000000000;
      auVar2._0_8_ = 0xbfe0000000000000;
      auVar11 = vaddpd_avx512vl(auVar11,auVar2);
      local_810 = local_7d0 * (auVar11._0_8_ + auVar11._0_8_);
      dStack_808 = local_7d0 * (auVar11._8_8_ + auVar11._8_8_);
      iVar6 = rand();
      dVar15 = (double)iVar6 / 2147483647.0 + -0.5;
      local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_810 +
            local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
      local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = dStack_808 +
            local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (dVar15 + dVar15) * local_7d0 +
            local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
    }
    currentValue = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                               &local_830,1);
    uVar8 = 0;
    dVar15 = 0.01;
    dVar23 = 0.0;
    do {
      if (0x31 < uVar8) break;
      local_818 = currentValue;
      local_810 = dVar15;
      dStack_808 = dVar23;
      local_7e8 = uVar8;
      ge::getQuickJacobian
                (xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,&local_830,
                 currentValue,(Matrix<double,_1,_3,_1,_1,_3> *)local_4c0,1);
      auVar18._0_8_ = (double)local_4c0._8_8_ * (double)local_4c0._8_8_;
      auVar18._8_8_ = (double)local_4c0._16_8_ * (double)local_4c0._16_8_;
      auVar11 = vshufpd_avx(auVar18,auVar18,1);
      dVar15 = (double)local_4c0._0_8_ * (double)local_4c0._0_8_ + auVar18._0_8_ + auVar11._0_8_;
      if (dVar15 < 0.0) {
        local_7f8 = sqrt(dVar15);
      }
      else {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar15;
        auVar11 = vsqrtsd_avx(auVar16,auVar16);
        local_7f8 = auVar11._0_8_;
      }
      local_7f8 = 1.0 / local_7f8;
      local_7e0 = local_7f8 * (double)local_4c0._0_8_;
      dStack_7d8 = local_7f8 * (double)local_4c0._8_8_;
      local_7f8 = local_7f8 * (double)local_4c0._16_8_;
      auVar3._8_8_ = local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
      auVar3._0_8_ = local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
      auVar19._0_8_ = local_810 * local_7e0;
      auVar19._8_8_ = local_810 * dStack_7d8;
      local_7c0 = vsubpd_avx(auVar3,auVar19);
      local_7b0 = local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] - local_810 * local_7f8;
      currentValue = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                                 (cayley_t *)local_7c0,1);
      dVar15 = local_818;
      if ((local_7e8 == 0) && (currentValue < local_818)) {
        do {
          dVar23 = local_810 + local_810;
          dVar15 = currentValue;
          if (0.08 < dVar23) break;
          auVar4._8_8_ = local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[1];
          auVar4._0_8_ = local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0];
          auVar20._0_8_ = local_7e0 * dVar23;
          auVar20._8_8_ = dStack_7d8 * dVar23;
          local_7c0 = vsubpd_avx(auVar4,auVar20);
          local_7b0 = local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] - local_7f8 * dVar23;
          dStack_808 = 0.0;
          local_818 = currentValue;
          local_810 = dVar23;
          currentValue = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                                     (cayley_t *)local_7c0,1);
          dVar15 = local_818;
        } while (currentValue < local_818);
      }
      if (dVar15 < currentValue) {
        do {
          local_818 = dVar15;
          local_810 = local_810 * 0.5;
          dStack_808 = 0.0;
          auVar5._8_8_ = local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[1];
          auVar5._0_8_ = local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0];
          auVar21._0_8_ = local_7e0 * local_810;
          auVar21._8_8_ = dStack_7d8 * local_810;
          local_7c0 = vsubpd_avx(auVar5,auVar21);
          local_7b0 = local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[2] - local_7f8 * local_810;
          currentValue = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                                     (cayley_t *)local_7c0,1);
          dVar15 = local_818;
        } while (local_818 < currentValue);
      }
      uVar8 = local_7e8 + (1e-05 <= local_810);
      local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)local_7c0._0_8_;
      local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)local_7c0._8_8_;
      local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_7b0;
      dVar15 = local_810;
      dVar23 = dStack_808;
    } while (1e-05 <= local_810);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] *
         local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] +
         local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] *
         local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] +
         local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] *
         local_830.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    auVar11 = vsqrtsd_avx(auVar17,auVar17);
    if (0.01 <= auVar11._0_8_) {
      uVar7 = CONCAT71((int7)((ulong)zzF >> 8),1);
      auVar11._8_8_ = uStack_7c8;
      auVar11._0_8_ = local_7d0;
      iVar6 = local_7ec;
    }
    else {
      dVar15 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,&local_830
                           ,0);
      uVar8 = local_7e4 & 0xff;
      if (dVar15 <= 0.001) {
        uVar8 = 1;
      }
      uVar7 = (ulong)uVar8;
      auVar11._8_8_ = uStack_7c8;
      auVar11._0_8_ = local_7d0;
      iVar6 = local_7ec + (uint)(0.001 < dVar15);
    }
    if (((uVar7 & 1) != 0) || (4 < iVar6)) {
      ge::composeG(&local_5c0,xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,
                   &local_830);
      local_1c0 = false;
      lVar9 = 0;
      local_17c._0_1_ = false;
      local_17c._1_1_ = false;
      local_440 = 0.0;
      uStack_438 = 0;
      uStack_430 = 0;
      uStack_428 = 0;
      uStack_420 = 0;
      uStack_418 = 0;
      uStack_410 = 0;
      uStack_408 = 0;
      local_400._0_1_ = false;
      local_400._1_1_ = false;
      local_178 = -1;
      Eigen::EigenSolver<Eigen::Matrix<double,4,4,0,4,4>>::compute<Eigen::Matrix<double,4,4,0,4,4>>
                ((EigenSolver<Eigen::Matrix<double,4,4,0,4,4>> *)local_4c0,
                 (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_5c0,true);
      pdVar10 = local_600;
      local_600[0] = local_440;
      local_600[1] = (double)uStack_438;
      local_600[2] = (double)uStack_430;
      local_600[3] = (double)uStack_428;
      local_600[4] = (double)uStack_420;
      local_600[5] = (double)uStack_418;
      local_600[6] = (double)uStack_410;
      local_600[7] = (double)uStack_408;
      Eigen::EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::eigenvectors
                ((EigenSolver<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_4c0);
      auVar12 = vpbroadcastq_avx512vl();
      auVar12 = vpaddq_avx2(auVar12,_DAT_0025dbc0);
      auVar13 = vpbroadcastq_avx512vl();
      auVar13 = vpaddq_avx2(auVar13,_DAT_0025dbe0);
      do {
        local_6a0[lVar9] = *pdVar10;
        auVar14 = vpbroadcastq_avx512vl();
        auVar22 = vpsllq_avx2(auVar14,4);
        vpaddq_avx2(auVar12,auVar22);
        auVar22 = vgatherqpd_avx512vl(local_4c0._0_8_);
        auVar14 = vpsllq_avx2(auVar14,3);
        auVar14 = vpaddq_avx2(auVar13,auVar14);
        vscatterqpd_avx512vl(ZEXT832(0) + auVar14,0xffff,auVar22);
        lVar9 = lVar9 + 1;
        pdVar10 = pdVar10 + 2;
      } while (lVar9 != 4);
      dVar15 = 1.0 / dStack_668;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = dVar15 * local_680;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = dVar15 * dStack_678;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = dVar15 * dStack_670;
      (output->translation).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = dVar15 * dStack_668;
      math::cayley2rot(&local_830);
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[8] = local_4c8;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[0] = local_508;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[1] = dStack_500;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[2] = dStack_4f8;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[3] = dStack_4f0;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[4] = dStack_4e8;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[5] = dStack_4e0;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[6] = dStack_4d8;
      (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array[7] = dStack_4d0;
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = local_6a0[0];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = local_6a0[1];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = local_6a0[2];
      (output->eigenvalues).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = local_6a0[3];
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0] = local_680;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[1] = dStack_678;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[2] = dStack_670;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[3] = dStack_668;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[4] = dStack_660;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[5] = dStack_658;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[6] = dStack_650;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[7] = dStack_648;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[8] = local_640;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[9] = dStack_638;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[10] = dStack_630;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xb] = dStack_628;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xc] = dStack_620;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xd] = dStack_618;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xe] = dStack_610;
      (output->eigenvectors).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0xf] = dStack_608;
      return;
    }
  } while( true );
}

Assistant:

void
opengv::relative_pose::modules::ge_main2(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & startingPoint,
    geOutput_t & output )
{
  //todo: the optimization strategy is something that can possibly be improved:
  //-one idea is to check the gradient at the new sampling point, if that derives
  // too much, we have to stop
  //-another idea consists of having linear change of lambda, instead of exponential (safer, but slower)
  
  double lambda = 0.01;
  double maxLambda = 0.08;
  double modifier = 2.0;
  int maxIterations = 50;
  double min_xtol = 0.00001;
  bool disablingIncrements = true;
  bool print = false;

  cayley_t cayley;
  
  double disturbanceAmplitude = 0.3;
  bool found = false;
  int randomTrialCount = 0;
  
  while( !found && randomTrialCount < 5 )
  {
    if(randomTrialCount > 2)
      disturbanceAmplitude = 0.6;
	
    if( randomTrialCount == 0 )
      cayley = startingPoint;
    else
    {
      cayley = startingPoint;
      Eigen::Vector3d disturbance;
      disturbance[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      disturbance[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      disturbance[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0*disturbanceAmplitude;
      cayley += disturbance;
    }
	
    lambda = 0.01;
    int iterations = 0;
    double smallestEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
        x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,1);
    
    while( iterations < maxIterations )
    {
      Eigen::Matrix<double,1,3> jacobian;
      ge::getQuickJacobian(xxF,yyF,zzF,xyF,yzF,zxF,
          x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,smallestEV,jacobian,1);
      
      double norm = sqrt(pow(jacobian[0],2.0) + pow(jacobian[1],2.0) + pow(jacobian[2],2.0));
      cayley_t normalizedJacobian = (1/norm) * jacobian.transpose();
      
      cayley_t samplingPoint = cayley - lambda * normalizedJacobian;
      double samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
          x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
      
      if(print)
      {
        std::cout << iterations << ": " << samplingPoint.transpose();
        std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
      }
      
      if( iterations == 0 || !disablingIncrements )
      {
        while( samplingEV < smallestEV )
        {
          smallestEV = samplingEV;
          if( lambda * modifier > maxLambda )
            break;
          lambda *= modifier;
          samplingPoint = cayley - lambda * normalizedJacobian;
          samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
              x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
          
          if(print)
          {
            std::cout << iterations << ": " << samplingPoint.transpose();
            std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
          }
        }
      }
      
      while( samplingEV > smallestEV )
      {
        lambda /= modifier;
        samplingPoint = cayley - lambda * normalizedJacobian;
        samplingEV = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
            x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,samplingPoint,1);
        
        if(print)
        {
          std::cout << iterations << ": " << samplingPoint.transpose();
          std::cout << " lambda: " << lambda << " EV: " << samplingEV << std::endl;
        }
      }
      
      //apply update
      cayley = samplingPoint;
      smallestEV = samplingEV;
      
      //stopping condition (check if the update was too small)
      if( lambda < min_xtol )
        break;
      
      iterations++;
    }
    
    //try to see if we can robustly identify each time we enter up in the wrong minimum
    if( cayley.norm() < 0.01 )
    {
      //we are close to the origin, test the EV 2
      double ev2 = ge::getCost(xxF,yyF,zzF,xyF,yzF,zxF,
            x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley,0);
      if( ev2 > 0.001 )
        randomTrialCount++;
      else
        found = true;
    }
    else
      found = true;
  }
  
  Eigen::Matrix4d G = ge::composeG(xxF,yyF,zzF,xyF,yzF,zxF,
      x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  Eigen::EigenSolver< Eigen::Matrix4d > Eig(G,true);
  Eigen::Matrix<std::complex<double>,4,1> D_complex = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,4,4> V_complex = Eig.eigenvectors();
  Eigen::Vector4d D;
  Eigen::Matrix4d V;
  for(size_t i = 0; i < 4; i++)
  {
    D[i] = D_complex[i].real();
    for(size_t j = 0; j < 4; j++)
      V(i,j) = V_complex(i,j).real();
  }

  double factor = V(3,0);
  Eigen::Vector4d t = (1.0/factor) * V.col(0);

  output.translation = t;
  output.rotation = math::cayley2rot(cayley);
  output.eigenvalues = D;
  output.eigenvectors = V;
}